

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_CallFlowGraph.h
# Opt level: O2

CallSequenceCheckResults *
soul::CallFlowGraph::checkFunctionCallSequences
          (CallSequenceCheckResults *__return_storage_ptr__,Program *program)

{
  pointer ppVar1;
  pool_ref<soul::heart::Function> *ppVar2;
  size_t sVar3;
  pool_ref<soul::Module> *m;
  pointer ppVar4;
  long lVar5;
  const_iterator __begin2;
  pointer ppVar6;
  const_iterator __end2;
  
  ppVar1 = (program->pimpl->modules).
           super__Vector_base<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  ppVar6 = (program->pimpl->modules).
           super__Vector_base<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  for (ppVar4 = ppVar6; ppVar4 != ppVar1; ppVar4 = ppVar4 + 1) {
    ppVar2 = (ppVar4->object->functions).functions.items;
    sVar3 = (ppVar4->object->functions).functions.numActive;
    for (lVar5 = 0; sVar3 << 3 != lVar5; lVar5 = lVar5 + 8) {
      *(undefined8 *)(*(long *)((long)&ppVar2->object + lVar5) + 0xd8) = 0;
    }
  }
  (__return_storage_ptr__->recursiveFunctionCallSequence).
  super__Vector_base<soul::pool_ref<soul::heart::Function>,_std::allocator<soul::pool_ref<soul::heart::Function>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->recursiveFunctionCallSequence).
  super__Vector_base<soul::pool_ref<soul::heart::Function>,_std::allocator<soul::pool_ref<soul::heart::Function>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __return_storage_ptr__->maximumStackSize = 0;
  (__return_storage_ptr__->recursiveFunctionCallSequence).
  super__Vector_base<soul::pool_ref<soul::heart::Function>,_std::allocator<soul::pool_ref<soul::heart::Function>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  for (; ppVar6 != ppVar1; ppVar6 = ppVar6 + 1) {
    ppVar2 = (ppVar6->object->functions).functions.items;
    sVar3 = (ppVar6->object->functions).functions.numActive;
    for (lVar5 = 0; sVar3 << 3 != lVar5; lVar5 = lVar5 + 8) {
      iterateCallSequences
                (*(Function **)((long)&ppVar2->object + lVar5),__return_storage_ptr__,
                 (PreviousCall *)0x0,0);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static CallSequenceCheckResults checkFunctionCallSequences (const Program& program)
    {
        for (auto& m : program.getModules())
            for (auto& f : m->functions.get())
                f->localVariableStackSize = 0;

        CallSequenceCheckResults results;

        for (auto& m : program.getModules())
            for (auto& f : m->functions.get())
                iterateCallSequences (f, results, nullptr, 0);

        return results;
    }